

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O2

void __thiscall cppwinrt::writer::write_code(writer *this,string_view *value)

{
  char value_00;
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  string_view local_40;
  
  sVar1 = value->_M_len;
  pcVar2 = value->_M_str;
  sVar3 = 0;
  do {
    if (sVar1 == sVar3) {
      return;
    }
    value_00 = pcVar2[sVar3];
    if (value_00 == '.') {
      local_40._M_len = 2;
      local_40._M_str = "::";
      writer_base<cppwinrt::writer>::write_impl
                (&this->super_writer_base<cppwinrt::writer>,&local_40);
    }
    else {
      if (value_00 == '`') {
        return;
      }
      writer_base<cppwinrt::writer>::write_impl(&this->super_writer_base<cppwinrt::writer>,value_00)
      ;
    }
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

void write_code(std::string_view const& value)
        {
            for (auto&& c : value)
            {
                if (c == '.')
                {
                    write("::");
                }
                else if (c == '`')
                {
                    return;
                }
                else
                {
                    write(c);
                }
            }
        }